

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Type *enum_value;
  EnumOptions *this_00;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar3 == 0) {
      LocationRecorder::LocationRecorder(&LStack_38,enum_location,3);
      *(byte *)(enum_type->_has_bits_).has_bits_ = (byte)(enum_type->_has_bits_).has_bits_[0] | 2;
      this_00 = enum_type->options_;
      if (this_00 == (EnumOptions *)0x0) {
        this_00 = (EnumOptions *)operator_new(0x70);
        EnumOptions::EnumOptions(this_00);
        enum_type->options_ = this_00;
      }
      bVar2 = ParseOption(this,&this_00->super_Message,&LStack_38,containing_file,OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&LStack_38,enum_location,2,
                 (enum_type->value_).super_RepeatedPtrFieldBase.current_size_);
      enum_value = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                             (&(enum_type->value_).super_RepeatedPtrFieldBase,(Type *)0x0);
      bVar2 = ParseEnumConstant(this,enum_value,&LStack_38,containing_file);
    }
    LocationRecorder::~LocationRecorder(&LStack_38);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location,
                                const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location,
                       containing_file, OPTION_STATEMENT);
  } else {
    LocationRecorder location(enum_location,
        EnumDescriptorProto::kValueFieldNumber, enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location, containing_file);
  }
}